

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_base.cpp
# Opt level: O2

void I_BuildMIDIMenuList(FOptionValues *opt)

{
  Pair *pPVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Reserve(&opt->mValues,6);
  uVar3 = (ulong)uVar2;
  pPVar1 = (opt->mValues).Array;
  FString::operator=(&pPVar1[uVar3].Text,"FluidSynth");
  pPVar1[uVar3].Value = -5.0;
  FString::operator=(&pPVar1[uVar3 + 1].Text,"GUS");
  pPVar1[uVar3 + 1].Value = -4.0;
  FString::operator=(&pPVar1[uVar3 + 2].Text,"OPL Synth Emulation");
  pPVar1[uVar3 + 2].Value = -3.0;
  FString::operator=(&pPVar1[uVar3 + 3].Text,"TiMidity++");
  pPVar1[uVar3 + 3].Value = -2.0;
  FString::operator=(&pPVar1[uVar3 + 4].Text,"WildMidi");
  pPVar1[uVar3 + 4].Value = -6.0;
  FString::operator=(&pPVar1[uVar3 + 5].Text,"Sound System");
  pPVar1[uVar3 + 5].Value = -1.0;
  return;
}

Assistant:

void I_BuildMIDIMenuList (FOptionValues *opt)
{
	AddDefaultMidiDevices(opt);
}